

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O3

_Bool xdr_dplx_decode(XDR *xdrs,rpc_msg *dmsg)

{
  msg_type *pmVar1;
  uint uVar2;
  _Bool _Var3;
  uint *puVar4;
  msg_type mVar5;
  uint *puVar6;
  uint *puVar7;
  undefined8 uVar8;
  uint *puVar9;
  char *pcVar10;
  
  puVar7 = (uint *)xdrs->x_data;
  puVar4 = (uint *)(xdrs->x_v).vio_tail;
  puVar6 = puVar7 + 5;
  puVar9 = puVar7;
  if ((puVar4 < puVar6) ||
     (xdrs->x_data = (uint8_t *)puVar6, puVar9 = puVar6, puVar7 == (uint *)0x0)) {
    puVar6 = puVar9 + 1;
    if (puVar4 < puVar6) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&dmsg->rm_xid);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR rm_xid";
        uVar8 = 0x1bd;
        goto LAB_00113473;
      }
      puVar6 = (uint *)xdrs->x_data;
      puVar4 = (uint *)(xdrs->x_v).vio_tail;
    }
    else {
      uVar2 = *puVar9;
      dmsg->rm_xid = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar6;
    }
    pmVar1 = &dmsg->rm_direction;
    if (puVar4 < puVar6 + 1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,pmVar1);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR rm_direction";
        uVar8 = 0x1c3;
LAB_00113473:
        (*__ntirpc_pkg_params.warnx_)(pcVar10,"xdr_dplx_decode",uVar8);
        return false;
      }
      mVar5 = *pmVar1;
    }
    else {
      uVar2 = *puVar6;
      mVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *pmVar1 = mVar5;
      xdrs->x_data = (uint8_t *)(puVar6 + 1);
    }
    puVar7 = (uint *)0x0;
  }
  else {
    uVar2 = *puVar7;
    dmsg->rm_xid = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = puVar7[1];
    puVar7 = puVar7 + 2;
    mVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    dmsg->rm_direction = mVar5;
  }
  if (mVar5 == REPLY) {
    _Var3 = xdr_reply_decode(xdrs,dmsg,(int32_t *)puVar7);
    return _Var3;
  }
  if (mVar5 != CALL) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_direction (%u)","xdr_dplx_decode",0x1d0);
    }
    return false;
  }
  _Var3 = xdr_call_decode(xdrs,dmsg,(int32_t *)puVar7);
  return _Var3;
}

Assistant:

bool
xdr_dplx_decode(XDR *xdrs, struct rpc_msg *dmsg)
{
	int32_t *buf;

	/*
	 * NOTE: 5 here, 3 more in each _decode
	 */
	buf = xdr_inline_decode(xdrs, 5 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		dmsg->rm_xid = IXDR_GET_U_INT32(buf);
		dmsg->rm_direction = IXDR_GET_ENUM(buf, enum msg_type);
	} else {
		if (!xdr_getuint32(xdrs, &(dmsg->rm_xid))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_direction))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_direction) {
	case CALL:
		return (xdr_call_decode(xdrs, dmsg, buf));
	case REPLY:
		return (xdr_reply_decode(xdrs, dmsg, buf));
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_direction (%u)",
			__func__, __LINE__,
			dmsg->rm_direction);
		break;
	};

	return (false);
}